

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-knowledge.c
# Opt level: O2

void mod_message(object *obj,wchar_t mod)

{
  char *fmt;
  
  switch(mod) {
  case L'\0':
    if (obj->modifiers[0] < 1) {
      if (-1 < obj->modifiers[0]) {
        return;
      }
      fmt = "You feel weaker!";
    }
    else {
      fmt = "You feel stronger!";
    }
    break;
  case L'\x01':
    if (obj->modifiers[1] < 1) {
      if (-1 < obj->modifiers[1]) {
        return;
      }
      fmt = "You feel more stupid!";
    }
    else {
      fmt = "You feel smarter!";
    }
    break;
  case L'\x02':
    if (obj->modifiers[2] < 1) {
      if (-1 < obj->modifiers[2]) {
        return;
      }
      fmt = "You feel more naive!";
    }
    else {
      fmt = "You feel wiser!";
    }
    break;
  case L'\x03':
    if (obj->modifiers[3] < 1) {
      if (-1 < obj->modifiers[3]) {
        return;
      }
      fmt = "You feel clumsier!";
    }
    else {
      fmt = "You feel more dextrous!";
    }
    break;
  case L'\x04':
    if (obj->modifiers[4] < 1) {
      if (-1 < obj->modifiers[4]) {
        return;
      }
      fmt = "You feel sicklier!";
    }
    else {
      fmt = "You feel healthier!";
    }
    break;
  case L'\x05':
    if (obj->modifiers[5] < 1) {
      if (-1 < obj->modifiers[5]) {
        return;
      }
      fmt = "You feel noisier.";
    }
    else {
      fmt = "You feel stealthier.";
    }
    break;
  default:
    return;
  case L'\a':
    fmt = "Your eyes tingle.";
    break;
  case L'\t':
    if (obj->modifiers[9] < 1) {
      if (-1 < obj->modifiers[9]) {
        return;
      }
      fmt = "You feel strangely sluggish.";
    }
    else {
      fmt = "You feel strangely quick.";
    }
    break;
  case L'\n':
    if (obj->modifiers[10] < 1) {
      if (-1 < obj->modifiers[10]) {
        return;
      }
      fmt = "Your weapon aches in your hands.";
    }
    else {
      fmt = "Your weapon tingles in your hands.";
    }
    break;
  case L'\v':
    if (obj->modifiers[0xb] < 1) {
      if (-1 < obj->modifiers[0xb]) {
        return;
      }
      fmt = "Your missile weapon aches in your hands.";
    }
    else {
      fmt = "Your missile weapon tingles in your hands.";
    }
    break;
  case L'\r':
    fmt = "It glows!";
  }
  msg(fmt);
  return;
}

Assistant:

static void mod_message(struct object *obj, int mod)
{
	/* Special messages for individual properties */
	switch (mod) {
		case OBJ_MOD_STR:
			if (obj->modifiers[OBJ_MOD_STR] > 0)
				msg("You feel stronger!");
			else if (obj->modifiers[OBJ_MOD_STR] < 0)
				msg("You feel weaker!");
			break;
		case OBJ_MOD_INT:
			if (obj->modifiers[OBJ_MOD_INT] > 0)
				msg("You feel smarter!");
			else if (obj->modifiers[OBJ_MOD_INT] < 0)
				msg("You feel more stupid!");
			break;
		case OBJ_MOD_WIS:
			if (obj->modifiers[OBJ_MOD_WIS] > 0)
				msg("You feel wiser!");
			else if (obj->modifiers[OBJ_MOD_WIS] < 0)
				msg("You feel more naive!");
			break;
		case OBJ_MOD_DEX:
			if (obj->modifiers[OBJ_MOD_DEX] > 0)
				msg("You feel more dextrous!");
			else if (obj->modifiers[OBJ_MOD_DEX] < 0)
				msg("You feel clumsier!");
			break;
		case OBJ_MOD_CON:
			if (obj->modifiers[OBJ_MOD_CON] > 0)
				msg("You feel healthier!");
			else if (obj->modifiers[OBJ_MOD_CON] < 0)
				msg("You feel sicklier!");
			break;
		case OBJ_MOD_STEALTH:
			if (obj->modifiers[OBJ_MOD_STEALTH] > 0)
				msg("You feel stealthier.");
			else if (obj->modifiers[OBJ_MOD_STEALTH] < 0)
				msg("You feel noisier.");
			break;
		case OBJ_MOD_SPEED:
			if (obj->modifiers[OBJ_MOD_SPEED] > 0)
				msg("You feel strangely quick.");
			else if (obj->modifiers[OBJ_MOD_SPEED] < 0)
				msg("You feel strangely sluggish.");
			break;
		case OBJ_MOD_BLOWS:
			if (obj->modifiers[OBJ_MOD_BLOWS] > 0)
				msg("Your weapon tingles in your hands.");
			else if (obj->modifiers[OBJ_MOD_BLOWS] < 0)
				msg("Your weapon aches in your hands.");
			break;
		case OBJ_MOD_SHOTS:
			if (obj->modifiers[OBJ_MOD_SHOTS] > 0)
				msg("Your missile weapon tingles in your hands.");
			else if (obj->modifiers[OBJ_MOD_SHOTS] < 0)
				msg("Your missile weapon aches in your hands.");
			break;
		case OBJ_MOD_INFRA:
			msg("Your eyes tingle.");
			break;
		case OBJ_MOD_LIGHT:
			msg("It glows!");
			break;
		default:
			break;
	}
}